

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

void __thiscall
kj::anon_unknown_77::AsyncTee::AsyncTee
          (AsyncTee *this,Own<kj::AsyncInputStream> *inner,uint64_t bufferSizeLimit)

{
  Own<kj::AsyncInputStream> *other;
  AsyncInputStream *pAVar1;
  Maybe<kj::(anonymous_namespace)::AsyncTee::Branch> *local_60;
  uint64_t bufferSizeLimit_local;
  Own<kj::AsyncInputStream> *inner_local;
  AsyncTee *this_local;
  
  Refcounted::Refcounted(&this->super_Refcounted);
  (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)&PTR_disposeImpl_007db898;
  other = mv<kj::Own<kj::AsyncInputStream>>(inner);
  Own<kj::AsyncInputStream>::Own(&this->inner,other);
  this->bufferSizeLimit = bufferSizeLimit;
  pAVar1 = Own<kj::AsyncInputStream>::operator->(&this->inner);
  (*pAVar1->_vptr_AsyncInputStream[2])(&this->length);
  local_60 = this->branches;
  do {
    Maybe<kj::(anonymous_namespace)::AsyncTee::Branch>::Maybe(local_60);
    local_60 = local_60 + 1;
  } while ((Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_> *)local_60 !=
           &this->stoppage);
  Maybe<kj::OneOf<kj::(anonymous_namespace)::AsyncTee::Eof,_kj::Exception>_>::Maybe(&this->stoppage)
  ;
  Promise<void>::Promise(&this->pullPromise);
  this->pulling = false;
  return;
}

Assistant:

explicit AsyncTee(Own<AsyncInputStream> inner, uint64_t bufferSizeLimit)
      : inner(mv(inner)), bufferSizeLimit(bufferSizeLimit), length(this->inner->tryGetLength()) {}